

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O2

char * __thiscall OSToken::index(OSToken *this,char *__s,int __c)

{
  _Rb_tree_node_base *__rhs;
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  int iVar4;
  long lVar5;
  undefined7 extraout_var;
  ulong uVar6;
  ObjectFile *pOVar7;
  _Base_ptr p_Var8;
  iterator iVar9;
  _Rb_tree_node_base *__v;
  _Self __tmp_2;
  _Self __tmp;
  _Self __tmp_1;
  char local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  _Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
  *local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokenFiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addedFiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newSet;
  MutexLocker lock;
  set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> newObjects;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  removedFiles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  MutexLocker::MutexLocker(&lock,this->tokenMutex);
  if ((int)__s == 0) {
    if (this->valid == true) {
      bVar3 = Generation::wasUpdated(this->gen);
      if (bVar3) goto LAB_0016491a;
    }
    uVar6 = CONCAT71((int7)((ulong)this >> 8),1);
    softHSMLog(7,"index",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
               ,0x251,"No re-indexing is required");
  }
  else {
LAB_0016491a:
    bVar3 = Directory::refresh(this->tokenDir);
    if ((bVar3) && (this->tokenObject->valid != false)) {
      softHSMLog(7,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x260,"Token %s has changed",(this->tokenPath)._M_dataplus._M_p);
      Directory::getFiles_abi_cxx11_(&tokenFiles,this->tokenDir);
      newSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &newSet._M_t._M_impl.super__Rb_tree_header._M_header;
      newSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      newSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      newSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_188 = &this->tokenPath;
      newSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           newSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (__v = (_Rb_tree_node_base *)
                 tokenFiles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          __v != (_Rb_tree_node_base *)
                 tokenFiles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __v = __v + 1) {
        if (__v->_M_parent < (_Base_ptr)0x8) {
LAB_00164a08:
          softHSMLog(7,"index",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x272,"Ignored file %s",*(undefined8 *)__v);
        }
        else {
          std::__cxx11::string::substr((ulong)&addedFiles,(ulong)__v);
          iVar4 = std::__cxx11::string::compare((char *)&addedFiles);
          if (iVar4 != 0) {
            std::__cxx11::string::~string((string *)&addedFiles);
            goto LAB_00164a08;
          }
          iVar4 = std::__cxx11::string::compare((char *)__v);
          std::__cxx11::string::~string((string *)&addedFiles);
          if (iVar4 == 0) goto LAB_00164a08;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&newSet,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v);
        }
      }
      addedFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &addedFiles._M_t._M_impl.super__Rb_tree_header._M_header;
      addedFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      addedFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      addedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      removedFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &removedFiles._M_t._M_impl.super__Rb_tree_header._M_header;
      removedFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      removedFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      removedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1b0 = (char)__s;
      addedFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           addedFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      removedFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           removedFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (local_1b0 == '\0') {
        p_Var1 = &(this->currentFiles)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = &newSet._M_t._M_impl.super__Rb_tree_header;
        for (p_Var8 = newSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var8 != p_Var2; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)
            ) {
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&(this->currentFiles)._M_t,(key_type *)(p_Var8 + 1));
          if ((_Rb_tree_header *)iVar9._M_node == p_Var1) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&addedFiles,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var8 + 1));
          }
        }
        __v = (_Rb_tree_node_base *)&newSet;
        for (p_Var8 = (this->currentFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var8 != p_Var1; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)
            ) {
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)__v,(key_type *)(p_Var8 + 1));
          if ((_Rb_tree_header *)iVar9._M_node == p_Var2) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&removedFiles,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var8 + 1));
          }
        }
      }
      else {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&addedFiles._M_t,&newSet._M_t);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&(this->currentFiles)._M_t,&newSet._M_t);
      softHSMLog(7,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x295,"%d objects were added and %d objects were removed",
                 addedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 removedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
      softHSMLog(7,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x296,"Current directory set contains %d objects");
      local_180 = (_Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
                   *)&this->allObjects;
      for (p_Var8 = addedFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &addedFiles._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        __rhs = p_Var8 + 1;
        lVar5 = std::__cxx11::string::rfind((char)__rhs,0x2e);
        if (lVar5 != -1) {
          std::__cxx11::string::rfind((char)__rhs,0x2e);
          std::__cxx11::string::substr((ulong)&newObjects,(ulong)__rhs);
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&newObjects,".object");
          __v = (_Rb_tree_node_base *)(CONCAT71(extraout_var,bVar3) & 0xffffffff);
          std::__cxx11::string::~string((string *)&newObjects);
          if ((char)__v == '\0') {
            std::__cxx11::string::string((string *)&newObjects,(string *)__rhs);
            uVar6 = std::__cxx11::string::rfind((char)(_Rb_tree_node_base *)&newObjects,0x2e);
            std::__cxx11::string::replace((ulong)&newObjects,uVar6,(char *)0xffffffffffffffff);
            pOVar7 = (ObjectFile *)operator_new(0xb0);
            std::operator+(&local_1a8,local_188,"/");
            std::operator+(&local_70,&local_1a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs);
            iVar4 = this->umask;
            std::operator+(&local_90,local_188,"/");
            std::operator+(&local_50,&local_90,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &newObjects);
            ObjectFile::ObjectFile(pOVar7,this,&local_70,iVar4,&local_50,false);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_1a8);
            ObjectFile::getFilename_abi_cxx11_(&local_1a8,pOVar7);
            softHSMLog(7,"index",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                       ,0x2ac,"(0x%08X) New object %s (0x%08X) added",this,
                       local_1a8._M_dataplus._M_p,pOVar7);
            std::__cxx11::string::~string((string *)&local_1a8);
            local_1a8._M_dataplus._M_p = (pointer)pOVar7;
            std::
            _Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
            ::_M_insert_unique<OSObject*>
                      ((_Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
                        *)&this->objects,(OSObject **)&local_1a8);
            local_1a8._M_dataplus._M_p = (pointer)pOVar7;
            std::
            _Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
            ::_M_insert_unique<OSObject*>(local_180,(OSObject **)&local_1a8);
            std::__cxx11::string::~string((string *)&newObjects);
            __v = (_Rb_tree_node_base *)&newObjects;
          }
        }
      }
      newObjects._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &newObjects._M_t._M_impl.super__Rb_tree_header._M_header;
      newObjects._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      newObjects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      newObjects._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      newObjects._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           newObjects._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (p_Var8 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar3 = (_Rb_tree_header *)p_Var8 == &(this->objects)._M_t._M_impl.super__Rb_tree_header,
          uVar6 = CONCAT71((int7)((ulong)__v >> 8),bVar3), !bVar3;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        lVar5 = *(long *)(p_Var8 + 1);
        if (lVar5 == 0) {
LAB_00164f22:
          softHSMLog(3,"index",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x2b9,"Object type not compatible with this token class 0x%08X",lVar5);
          goto LAB_00165037;
        }
        pOVar7 = (ObjectFile *)__dynamic_cast(lVar5,&OSObject::typeinfo,&ObjectFile::typeinfo,0);
        if (pOVar7 == (ObjectFile *)0x0) goto LAB_00164f22;
        ObjectFile::getFilename_abi_cxx11_(&local_1a8,pOVar7);
        __v = p_Var8 + 1;
        softHSMLog(7,"index",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                   ,0x2be,"Processing %s (0x%08X)",local_1a8._M_dataplus._M_p,*(OSObject **)__v);
        std::__cxx11::string::~string((string *)&local_1a8);
        ObjectFile::getFilename_abi_cxx11_(&local_1a8,pOVar7);
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&removedFiles._M_t,&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        if ((_Rb_tree_header *)iVar9._M_node == &removedFiles._M_t._M_impl.super__Rb_tree_header) {
          ObjectFile::getFilename_abi_cxx11_(&local_1a8,pOVar7);
          softHSMLog(7,"index",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x2c2,"Adding object %s",local_1a8._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::
          _Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
          ::_M_insert_unique<OSObject*const&>
                    ((_Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
                      *)&newObjects,(OSObject **)__v);
        }
        else {
          ObjectFile::invalidate(pOVar7);
        }
      }
      std::
      _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
      ::operator=(&(this->objects)._M_t,&newObjects._M_t);
      softHSMLog(7,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x2cf,"The token now contains %d objects",
                 (this->objects)._M_t._M_impl.super__Rb_tree_header._M_node_count);
LAB_00165037:
      std::
      _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
      ::~_Rb_tree(&newObjects._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&removedFiles._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&addedFiles._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&newSet._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tokenFiles);
    }
    else {
      softHSMLog(3,"index",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x259,"Token integrity check failed");
      this->valid = false;
      uVar6 = 0;
    }
  }
  MutexLocker::~MutexLocker(&lock);
  return (char *)(uVar6 & 0xffffffff);
}

Assistant:

bool OSToken::index(bool isFirstTime /* = false */)
{
	// No access to object mutable fields before
	MutexLocker lock(tokenMutex);

	// Check if re-indexing is required
	if (!isFirstTime && (!valid || !gen->wasUpdated()))
	{
		DEBUG_MSG("No re-indexing is required");

		return true;
	}

	// Check the integrity
	if (!tokenDir->refresh() || !tokenObject->valid)
	{
		ERROR_MSG("Token integrity check failed");

		valid = false;

		return false;
	}

	DEBUG_MSG("Token %s has changed", tokenPath.c_str());

	// Retrieve the directory listing
	std::vector<std::string> tokenFiles = tokenDir->getFiles();

	// Filter out the objects
	std::set<std::string> newSet;

	for (std::vector<std::string>::iterator i = tokenFiles.begin(); i != tokenFiles.end(); i++)
	{
		if ((i->size() > 7) &&
		    (!(i->substr(i->size() - 7).compare(".object"))) &&
		    (i->compare("token.object")))
		{
			newSet.insert(*i);
		}
		else
		{
			DEBUG_MSG("Ignored file %s", i->c_str());
		}
	}

	// Compute the changes compared to the last list of files
	std::set<std::string> addedFiles;
	std::set<std::string> removedFiles;

	if (!isFirstTime)
	{
		// First compute which files were added
		for (std::set<std::string>::iterator i = newSet.begin(); i != newSet.end(); i++)
		{
			if (currentFiles.find(*i) == currentFiles.end())
			{
				addedFiles.insert(*i);
			}
		}

		// Now compute which files were removed
		for (std::set<std::string>::iterator i = currentFiles.begin(); i != currentFiles.end(); i++)
		{
			if (newSet.find(*i) == newSet.end())
			{
				removedFiles.insert(*i);
			}
		}
	}
	else
	{
		addedFiles = newSet;
	}

	currentFiles = newSet;

	DEBUG_MSG("%d objects were added and %d objects were removed", addedFiles.size(), removedFiles.size());
	DEBUG_MSG("Current directory set contains %d objects", currentFiles.size());

	// Now update the set of objects

	// Add new objects
	for (std::set<std::string>::iterator i = addedFiles.begin(); i != addedFiles.end(); i++)
	{
		if ((i->find_last_of('.') == std::string::npos) ||
		    (i->substr(i->find_last_of('.')) != ".object"))
		{
			continue;
		}

		std::string lockName(*i);
		lockName.replace(lockName.find_last_of('.'), std::string::npos, ".lock");

		// Create a new token object for the added file
		ObjectFile* newObject = new ObjectFile(this, tokenPath + OS_PATHSEP + *i, umask, tokenPath + OS_PATHSEP + lockName);

		// Add the object, even invalid ones.
		// This is so the we can read the attributes once
		// the other process has finished writing to disc.
		DEBUG_MSG("(0x%08X) New object %s (0x%08X) added", this, newObject->getFilename().c_str(), newObject);
		objects.insert(newObject);
		allObjects.insert(newObject);
	}

	// Remove deleted objects
	std::set<OSObject*> newObjects;

	for (std::set<OSObject*>::iterator i = objects.begin(); i != objects.end(); i++)
	{
		ObjectFile* fileObject = dynamic_cast<ObjectFile*>((*i));
		if (fileObject == NULL)
		{
			ERROR_MSG("Object type not compatible with this token class 0x%08X", (*i));

			return false;
		}

		DEBUG_MSG("Processing %s (0x%08X)", fileObject->getFilename().c_str(), *i);

		if (removedFiles.find(fileObject->getFilename()) == removedFiles.end())
		{
			DEBUG_MSG("Adding object %s", fileObject->getFilename().c_str());
			// This object gets to stay in the set
			newObjects.insert(*i);
		}
		else
		{
			fileObject->invalidate();
		}
	}

	// Set the new objects
	objects = newObjects;

	DEBUG_MSG("The token now contains %d objects", objects.size());

	return true;
}